

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::bitcast_to_builtin_store
          (CompilerGLSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  string sStack_198;
  SPIRType type;
  
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)target_id,DecorationBuiltIn);
  if (bVar1) {
    uVar2 = Compiler::get_decoration(&this->super_Compiler,(ID)target_id,DecorationBuiltIn);
    if ((((uVar2 < 0xb) && ((0x680U >> (uVar2 & 0x1f) & 1) != 0)) || (uVar2 == 0x1396)) &&
       (*(int *)&(expr_type->super_IVariant).field_0xc != 7)) {
      SPIRType::SPIRType(&type,expr_type);
      type.super_IVariant._12_4_ = 7;
      bitcast_expression(&sStack_198,this,&type,*(BaseType *)&(expr_type->super_IVariant).field_0xc,
                         expr);
      ::std::__cxx11::string::operator=((string *)expr,(string *)&sStack_198);
      ::std::__cxx11::string::~string((string *)&sStack_198);
      SPIRType::~SPIRType(&type);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::bitcast_to_builtin_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
		expected_type = SPIRType::Int;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		auto type = expr_type;
		type.basetype = expected_type;
		expr = bitcast_expression(type, expr_type.basetype, expr);
	}
}